

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monsters.cpp
# Opt level: O1

void __thiscall MonsterThing::MonsterThing(MonsterThing *this)

{
  (this->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->pack;
  (this->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->pack;
  (this->pack).super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node._M_size =
       0;
  (this->stats).s_maxhp = 0;
  this->reserved = 0;
  (this->pos).x = 0;
  (this->pos).y = 0;
  *(undefined8 *)((long)&(this->pos).y + 2) = 0;
  this->dest = (coord *)0x0;
  this->flags = 0;
  (this->stats).s_str = 0;
  (this->stats).s_exp = 0;
  (this->stats).s_lvl = 0;
  (this->stats).s_arm = 0;
  (this->stats).s_hpt = 0;
  (this->stats).s_dmg[0] = '\0';
  return;
}

Assistant:

MonsterThing::MonsterThing()
{
    pos.x = pos.y = 0;                        /* Position */
    turn_delay = 0;
    type = 0;                        /* What it is */
    disguise = 0;                /* What mimic looks like */
    dest = nullptr;                        /* Where it is running to */
    flags = 0;                        /* State word */
    stats.s_str = 0;                        /* Strength */
    stats.s_exp = 0;                                /* Experience */
    stats.s_lvl = 0;                                /* level of mastery */
    stats.s_arm = 0;                                /* Armor class */
    stats.s_hpt = 0;                        /* Hit points */
    stats.s_dmg[0] = 0;                        /* String describing damage done */
    stats.s_maxhp = 0;                        /* Max hit points */
    reserved = 0;
}